

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O1

bool __thiscall asmjit::CodeEmitter::isLabelValid(CodeEmitter *this,uint32_t id)

{
  if (this->_code != (CodeHolder *)0x0) {
    return (ulong)(id - 0x100) < (this->_code->_labels).super_ZoneVectorBase._length;
  }
  return false;
}

Assistant:

bool CodeEmitter::isLabelValid(uint32_t id) const noexcept {
  size_t index = Operand::unpackId(id);
  return _code && index < _code->_labels.getLength();
}